

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderLibraryCase.cpp
# Opt level: O0

string * __thiscall
deqp::gls::genVertexShader_abi_cxx11_
          (string *__return_storage_ptr__,gls *this,ShaderCaseSpecification *spec)

{
  bool bVar1;
  DataType DVar2;
  DataType dataType;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  ostream *poVar6;
  Value *pVVar7;
  const_reference pvVar8;
  string *psVar9;
  string *name;
  Value *val_1;
  size_t ndx_1;
  char *typeStr;
  DataType floatType;
  DataType basicType;
  Value *val;
  size_t ndx;
  char *vtxOut;
  char *vtxIn;
  undefined1 local_190 [7];
  bool usesInout;
  ostringstream res;
  ShaderCaseSpecification *spec_local;
  
  res._368_8_ = this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  bVar1 = glu::glslVersionUsesInOutQualifiers(*(GLSLVersion *)(res._368_8_ + 8));
  pcVar3 = "attribute";
  if (bVar1) {
    pcVar3 = "in";
  }
  pcVar4 = "varying";
  if (bVar1) {
    pcVar4 = "out";
  }
  pcVar5 = glu::getGLSLVersionDeclaration(*(GLSLVersion *)(res._368_8_ + 8));
  poVar6 = std::operator<<((ostream *)local_190,pcVar5);
  std::operator<<(poVar6,"\n");
  std::operator<<((ostream *)local_190,"precision highp float;\n");
  std::operator<<((ostream *)local_190,"precision highp int;\n");
  std::operator<<((ostream *)local_190,"\n");
  poVar6 = std::operator<<((ostream *)local_190,pcVar3);
  std::operator<<(poVar6," highp vec4 dEQP_Position;\n");
  val = (Value *)0x0;
  while( true ) {
    pVVar7 = (Value *)std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::size
                                ((vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> *)
                                 (res._368_8_ + 0x30));
    if (pVVar7 <= val) break;
    pvVar8 = std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::operator[]
                       ((vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> *)
                        (res._368_8_ + 0x30),(size_type)val);
    DVar2 = glu::VarType::getBasicType(&pvVar8->type);
    dataType = glu::getDataTypeFloatScalars(DVar2);
    pcVar5 = glu::getDataTypeName(dataType);
    poVar6 = std::operator<<((ostream *)local_190,pcVar3);
    poVar6 = std::operator<<(poVar6," ");
    poVar6 = std::operator<<(poVar6,pcVar5);
    poVar6 = std::operator<<(poVar6," a_");
    poVar6 = std::operator<<(poVar6,(string *)&pvVar8->name);
    std::operator<<(poVar6,";\n");
    DVar2 = glu::getDataTypeScalarType(DVar2);
    if (DVar2 == TYPE_FLOAT) {
      poVar6 = std::operator<<((ostream *)local_190,pcVar4);
      poVar6 = std::operator<<(poVar6," ");
      poVar6 = std::operator<<(poVar6,pcVar5);
      poVar6 = std::operator<<(poVar6," ");
      poVar6 = std::operator<<(poVar6,(string *)&pvVar8->name);
      std::operator<<(poVar6,";\n");
    }
    else {
      poVar6 = std::operator<<((ostream *)local_190,pcVar4);
      poVar6 = std::operator<<(poVar6," ");
      poVar6 = std::operator<<(poVar6,pcVar5);
      poVar6 = std::operator<<(poVar6," v_");
      poVar6 = std::operator<<(poVar6,(string *)&pvVar8->name);
      std::operator<<(poVar6,";\n");
    }
    val = (Value *)((long)&(val->type).m_type + 1);
  }
  std::operator<<((ostream *)local_190,"\n");
  std::operator<<((ostream *)local_190,"void main()\n");
  std::operator<<((ostream *)local_190,"{\n");
  std::operator<<((ostream *)local_190,"\tgl_Position = dEQP_Position;\n");
  val_1 = (Value *)0x0;
  while( true ) {
    pVVar7 = (Value *)std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::size
                                ((vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> *)
                                 (res._368_8_ + 0x30));
    if (pVVar7 <= val_1) break;
    pvVar8 = std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::operator[]
                       ((vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> *)
                        (res._368_8_ + 0x30),(size_type)val_1);
    psVar9 = &pvVar8->name;
    DVar2 = glu::VarType::getBasicType(&pvVar8->type);
    DVar2 = glu::getDataTypeScalarType(DVar2);
    if (DVar2 == TYPE_FLOAT) {
      poVar6 = std::operator<<((ostream *)local_190,"\t");
      poVar6 = std::operator<<(poVar6,(string *)psVar9);
      poVar6 = std::operator<<(poVar6," = a_");
      poVar6 = std::operator<<(poVar6,(string *)psVar9);
      std::operator<<(poVar6,";\n");
    }
    else {
      poVar6 = std::operator<<((ostream *)local_190,"\tv_");
      poVar6 = std::operator<<(poVar6,(string *)psVar9);
      poVar6 = std::operator<<(poVar6," = a_");
      poVar6 = std::operator<<(poVar6,(string *)psVar9);
      std::operator<<(poVar6,";\n");
    }
    val_1 = (Value *)((long)&(val_1->type).m_type + 1);
  }
  std::operator<<((ostream *)local_190,"}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  return __return_storage_ptr__;
}

Assistant:

static string genVertexShader (const ShaderCaseSpecification& spec)
{
	ostringstream		res;
	const bool			usesInout	= glslVersionUsesInOutQualifiers(spec.targetVersion);
	const char* const	vtxIn		= usesInout ? "in"	: "attribute";
	const char* const	vtxOut		= usesInout ? "out"	: "varying";

	res << glu::getGLSLVersionDeclaration(spec.targetVersion) << "\n";

	// Declarations (position + attribute/varying for each input).
	res << "precision highp float;\n";
	res << "precision highp int;\n";
	res << "\n";
	res << vtxIn << " highp vec4 dEQP_Position;\n";

	for (size_t ndx = 0; ndx < spec.values.inputs.size(); ndx++)
	{
		const Value&		val			= spec.values.inputs[ndx];
		const DataType		basicType	= val.type.getBasicType();
		const DataType		floatType	= getDataTypeFloatScalars(basicType);
		const char* const	typeStr		= getDataTypeName(floatType);

		res << vtxIn << " " << typeStr << " a_" << val.name << ";\n";

		if (getDataTypeScalarType(basicType) == TYPE_FLOAT)
			res << vtxOut << " " << typeStr << " " << val.name << ";\n";
		else
			res << vtxOut << " " << typeStr << " v_" << val.name << ";\n";
	}
	res << "\n";

	// Main function.
	// - gl_Position = dEQP_Position;
	// - for each input: write attribute directly to varying
	res << "void main()\n";
	res << "{\n";
	res << "	gl_Position = dEQP_Position;\n";
	for (size_t ndx = 0; ndx < spec.values.inputs.size(); ndx++)
	{
		const Value&	val		= spec.values.inputs[ndx];
		const string&	name	= val.name;

		if (getDataTypeScalarType(val.type.getBasicType()) == TYPE_FLOAT)
			res << "	" << name << " = a_" << name << ";\n";
		else
			res << "	v_" << name << " = a_" << name << ";\n";
	}

	res << "}\n";
	return res.str();
}